

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxJumpStatement::Emit(FxJumpStatement *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  char *in_RAX;
  size_t sVar2;
  FString local_28;
  
  if (this->AddressResolver == (FxExpression *)0x0) {
    local_28.Chars = in_RAX;
    FScanner::TokenName((FScanner *)&stack0xffffffffffffffd8,
                        *(int *)&(this->super_FxExpression).field_0x34,(char *)0x0);
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Jump statement %s has nowhere to go!",
               local_28.Chars);
    FString::~FString(&stack0xffffffffffffffd8);
  }
  sVar2 = VMFunctionBuilder::Emit(build,0x37,0);
  this->Address = sVar2;
  EVar1.RegNum = '\0';
  EVar1.RegType = 0xff;
  EVar1._2_1_ = 0;
  return EVar1;
}

Assistant:

ExpEmit FxJumpStatement::Emit(VMFunctionBuilder *build)
{
	if (AddressResolver == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Jump statement %s has nowhere to go!", FScanner::TokenName(Token).GetChars());
	}

	Address = build->Emit(OP_JMP, 0);

	return ExpEmit();
}